

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O0

alignment_end *
sw_sse2_word(int8_t *ref,int8_t ref_dir,int32_t refLen,int32_t readLen,uint8_t weight_gapO,
            uint8_t weight_gapE,__m128i *vProfile,uint16_t terminate,int32_t maskLen)

{
  char cVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  longlong lVar5;
  longlong lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  ulong uVar14;
  undefined7 uVar15;
  undefined7 uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  __m128i *palVar21;
  __m128i *palVar22;
  int iVar23;
  int iVar24;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  uint16_t *__ptr_02;
  undefined1 (*pauVar25) [16];
  longlong *plVar26;
  alignment_end *paVar27;
  ushort uVar28;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  undefined1 auVar29 [16];
  ushort uVar38;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int local_55c;
  int local_558;
  int32_t temp_1;
  ushort uStack_524;
  uint16_t temp;
  __m128i vH;
  __m128i vF;
  __m128i e;
  int32_t cmp;
  __m128i *vP;
  __m128i vMaxColumn;
  __m128i *pv;
  alignment_end *bests;
  uint16_t *puStack_4c0;
  int32_t column_len;
  uint16_t *t;
  int32_t step;
  int32_t end;
  int32_t begin;
  int32_t edge;
  __m128i vTemp;
  __m128i vMaxMark;
  __m128i vMaxScore;
  __m128i vGapE;
  __m128i vGapO;
  int local_450;
  int32_t k;
  int32_t j;
  int32_t i;
  __m128i *pvHmax;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i vZero;
  int32_t *end_read_column;
  uint16_t *maxColumn;
  int32_t local_400;
  int32_t segLen;
  int32_t end_ref;
  int32_t end_read;
  uint16_t max;
  uint8_t weight_gapE_local;
  uint8_t weight_gapO_local;
  int32_t readLen_local;
  int32_t refLen_local;
  int8_t ref_dir_local;
  int8_t *ref_local;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  ushort local_58;
  ushort uStack_56;
  ushort uStack_54;
  ushort uStack_52;
  ushort uStack_50;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  
  end_ref._0_2_ = 0;
  segLen = readLen + -1;
  local_400 = 0;
  iVar23 = readLen + 7;
  if (readLen + 7 < 0) {
    iVar23 = readLen + 0xe;
  }
  iVar23 = iVar23 >> 3;
  __ptr = calloc((long)refLen,2);
  __ptr_00 = calloc((long)refLen,4);
  vTemp[1] = 0;
  vMaxMark[0] = 0;
  pvHLoad = (__m128i *)calloc((long)iVar23,0x10);
  pvE = (__m128i *)calloc((long)iVar23,0x10);
  __ptr_01 = calloc((long)iVar23,0x10);
  __ptr_02 = (uint16_t *)calloc((long)iVar23,0x10);
  uVar13 = CONCAT17(0,CONCAT16(weight_gapO,
                               (uint6)CONCAT14(weight_gapO,
                                               (uint)CONCAT12(weight_gapO,(ushort)weight_gapO))));
  uVar15 = CONCAT16(weight_gapO,
                    (uint6)CONCAT14(weight_gapO,(uint)CONCAT12(weight_gapO,(ushort)weight_gapO)));
  uVar14 = CONCAT17(0,CONCAT16(weight_gapE,
                               (uint6)CONCAT14(weight_gapE,
                                               (uint)CONCAT12(weight_gapE,(ushort)weight_gapE))));
  uVar16 = CONCAT16(weight_gapE,
                    (uint6)CONCAT14(weight_gapE,(uint)CONCAT12(weight_gapE,(ushort)weight_gapE)));
  vMaxMark[1]._0_2_ = 0;
  uVar17 = (ushort)vMaxMark[1];
  vMaxMark[1]._2_2_ = 0;
  uVar18 = vMaxMark[1]._2_2_;
  vMaxMark[1]._4_2_ = 0;
  vMaxMark[1]._6_2_ = 0;
  vMaxScore[0]._0_2_ = 0;
  uVar19 = (ushort)vMaxScore[0];
  vMaxScore[0]._2_2_ = 0;
  uVar20 = vMaxScore[0]._2_2_;
  vMaxScore[0]._4_2_ = 0;
  vMaxScore[0]._6_2_ = 0;
  step = 0;
  t._0_4_ = 1;
  t._4_4_ = refLen;
  if (ref_dir == '\x01') {
    step = refLen + -1;
    t._4_4_ = -1;
    t._0_4_ = -1;
  }
  for (k = step; palVar22 = pvHLoad, palVar21 = pvE, k != t._4_4_; k = (int)t + k) {
    stack0xfffffffffffffae8 = ZEXT816(0);
    uVar2 = pvHLoad[iVar23 + -1][0];
    vH[0] = pvHLoad[iVar23 + -1][1] << 0x10 | uVar2 >> 0x30;
    _temp_1 = uVar2 << 0x10;
    vP._4_2_ = 0;
    vP._6_2_ = 0;
    vMaxColumn[0]._4_2_ = 0;
    vMaxColumn[0]._6_2_ = 0;
    cVar1 = ref[k];
    pvE = pvHLoad;
    pvHLoad = palVar21;
    vP._0_2_ = uVar17;
    vP._2_2_ = uVar18;
    vMaxColumn[0]._0_2_ = uVar19;
    vMaxColumn[0]._2_2_ = uVar20;
    for (local_450 = 0; local_450 < iVar23; local_450 = local_450 + 1) {
      auVar29 = paddsw((undefined1  [16])_temp_1,
                       (undefined1  [16])vProfile[(long)(cVar1 * iVar23) + (long)local_450]);
      pauVar25 = (undefined1 (*) [16])((long)__ptr_01 + (long)local_450 * 0x10);
      uVar3 = *(undefined8 *)*pauVar25;
      uVar4 = *(undefined8 *)(*pauVar25 + 8);
      auVar31 = *pauVar25;
      local_138 = auVar29._0_2_;
      sStack_136 = auVar29._2_2_;
      sStack_134 = auVar29._4_2_;
      sStack_132 = auVar29._6_2_;
      sStack_130 = auVar29._8_2_;
      sStack_12e = auVar29._10_2_;
      sStack_12c = auVar29._12_2_;
      sStack_12a = auVar29._14_2_;
      local_148 = (short)uVar3;
      sStack_146 = (short)((ulong)uVar3 >> 0x10);
      sStack_144 = (short)((ulong)uVar3 >> 0x20);
      sStack_142 = (short)((ulong)uVar3 >> 0x30);
      sStack_140 = (short)uVar4;
      sStack_13e = (short)((ulong)uVar4 >> 0x10);
      sStack_13c = (short)((ulong)uVar4 >> 0x20);
      sStack_13a = (short)((ulong)uVar4 >> 0x30);
      uVar28 = (ushort)(local_138 < local_148) * local_148 |
               (ushort)(local_138 >= local_148) * local_138;
      uVar32 = (ushort)(sStack_136 < sStack_146) * sStack_146 |
               (ushort)(sStack_136 >= sStack_146) * sStack_136;
      uVar33 = (ushort)(sStack_134 < sStack_144) * sStack_144 |
               (ushort)(sStack_134 >= sStack_144) * sStack_134;
      uVar34 = (ushort)(sStack_132 < sStack_142) * sStack_142 |
               (ushort)(sStack_132 >= sStack_142) * sStack_132;
      uVar35 = (ushort)(sStack_130 < sStack_140) * sStack_140 |
               (ushort)(sStack_130 >= sStack_140) * sStack_130;
      uVar36 = (ushort)(sStack_12e < sStack_13e) * sStack_13e |
               (ushort)(sStack_12e >= sStack_13e) * sStack_12e;
      uVar37 = (ushort)(sStack_12c < sStack_13c) * sStack_13c |
               (ushort)(sStack_12c >= sStack_13c) * sStack_12c;
      uVar38 = (ushort)(sStack_12a < sStack_13a) * sStack_13a |
               (ushort)(sStack_12a >= sStack_13a) * sStack_12a;
      local_168 = (short)vH[1];
      sStack_166 = vH[1]._2_2_;
      sStack_164 = vH[1]._4_2_;
      sStack_162 = vH[1]._6_2_;
      sStack_160 = (short)vH[2];
      sStack_15e = vH[2]._2_2_;
      sStack_15c = vH[2]._4_2_;
      sStack_15a = vH[2]._6_2_;
      uVar28 = (ushort)((short)uVar28 < local_168) * local_168 |
               ((short)uVar28 >= local_168) * uVar28;
      uVar32 = (ushort)((short)uVar32 < sStack_166) * sStack_166 |
               ((short)uVar32 >= sStack_166) * uVar32;
      uVar33 = (ushort)((short)uVar33 < sStack_164) * sStack_164 |
               ((short)uVar33 >= sStack_164) * uVar33;
      uVar34 = (ushort)((short)uVar34 < sStack_162) * sStack_162 |
               ((short)uVar34 >= sStack_162) * uVar34;
      uVar35 = (ushort)((short)uVar35 < sStack_160) * sStack_160 |
               ((short)uVar35 >= sStack_160) * uVar35;
      uVar36 = (ushort)((short)uVar36 < sStack_15e) * sStack_15e |
               ((short)uVar36 >= sStack_15e) * uVar36;
      uVar37 = (ushort)((short)uVar37 < sStack_15c) * sStack_15c |
               ((short)uVar37 >= sStack_15c) * uVar37;
      uVar38 = (ushort)((short)uVar38 < sStack_15a) * sStack_15a |
               ((short)uVar38 >= sStack_15a) * uVar38;
      temp_1 = CONCAT22(uVar32,uVar28);
      _temp_1 = CONCAT24(uVar33,temp_1);
      _temp_1 = CONCAT26(uVar34,_temp_1);
      vH[0]._0_2_ = uVar35;
      vH[0]._2_2_ = uVar36;
      vH[0]._4_2_ = uVar37;
      vH[0]._6_2_ = uVar38;
      vP._0_2_ = ((short)(ushort)vP < (short)uVar28) * uVar28 |
                 ((short)(ushort)vP >= (short)uVar28) * (ushort)vP;
      vP._2_2_ = ((short)vP._2_2_ < (short)uVar32) * uVar32 |
                 ((short)vP._2_2_ >= (short)uVar32) * vP._2_2_;
      vP._4_2_ = ((short)vP._4_2_ < (short)uVar33) * uVar33 |
                 ((short)vP._4_2_ >= (short)uVar33) * vP._4_2_;
      vP._6_2_ = ((short)vP._6_2_ < (short)uVar34) * uVar34 |
                 ((short)vP._6_2_ >= (short)uVar34) * vP._6_2_;
      vMaxColumn[0]._0_2_ =
           ((short)(ushort)vMaxColumn[0] < (short)uVar35) * uVar35 |
           ((short)(ushort)vMaxColumn[0] >= (short)uVar35) * (ushort)vMaxColumn[0];
      vMaxColumn[0]._2_2_ =
           ((short)vMaxColumn[0]._2_2_ < (short)uVar36) * uVar36 |
           ((short)vMaxColumn[0]._2_2_ >= (short)uVar36) * vMaxColumn[0]._2_2_;
      vMaxColumn[0]._4_2_ =
           ((short)vMaxColumn[0]._4_2_ < (short)uVar37) * uVar37 |
           ((short)vMaxColumn[0]._4_2_ >= (short)uVar37) * vMaxColumn[0]._4_2_;
      vMaxColumn[0]._6_2_ =
           ((short)vMaxColumn[0]._6_2_ < (short)uVar38) * uVar38 |
           ((short)vMaxColumn[0]._6_2_ >= (short)uVar38) * vMaxColumn[0]._6_2_;
      palVar21[local_450][0] = _temp_1;
      palVar21[local_450][1] = vH[0];
      auVar12._8_8_ = vH[0];
      auVar12._0_8_ = _temp_1;
      auVar30._8_7_ = uVar15;
      auVar30._0_8_ = uVar13;
      auVar30[0xf] = 0;
      auVar30 = psubusw(auVar12,auVar30);
      auVar29._8_7_ = uVar16;
      auVar29._0_8_ = uVar14;
      auVar29[0xf] = 0;
      auVar31 = psubusw(auVar31,auVar29);
      local_198 = auVar31._0_2_;
      sStack_196 = auVar31._2_2_;
      sStack_194 = auVar31._4_2_;
      sStack_192 = auVar31._6_2_;
      sStack_190 = auVar31._8_2_;
      sStack_18e = auVar31._10_2_;
      sStack_18c = auVar31._12_2_;
      sStack_18a = auVar31._14_2_;
      local_1a8 = auVar30._0_2_;
      sStack_1a6 = auVar30._2_2_;
      sStack_1a4 = auVar30._4_2_;
      sStack_1a2 = auVar30._6_2_;
      sStack_1a0 = auVar30._8_2_;
      sStack_19e = auVar30._10_2_;
      sStack_19c = auVar30._12_2_;
      sStack_19a = auVar30._14_2_;
      vF[1] = CONCAT26((ushort)(sStack_192 < sStack_1a2) * sStack_1a2 |
                       (ushort)(sStack_192 >= sStack_1a2) * sStack_192,
                       CONCAT24((ushort)(sStack_194 < sStack_1a4) * sStack_1a4 |
                                (ushort)(sStack_194 >= sStack_1a4) * sStack_194,
                                CONCAT22((ushort)(sStack_196 < sStack_1a6) * sStack_1a6 |
                                         (ushort)(sStack_196 >= sStack_1a6) * sStack_196,
                                         (ushort)(local_198 < local_1a8) * local_1a8 |
                                         (ushort)(local_198 >= local_1a8) * local_198)));
      e[0]._0_2_ = (ushort)(sStack_190 < sStack_1a0) * sStack_1a0 |
                   (ushort)(sStack_190 >= sStack_1a0) * sStack_190;
      e[0]._2_2_ = (ushort)(sStack_18e < sStack_19e) * sStack_19e |
                   (ushort)(sStack_18e >= sStack_19e) * sStack_18e;
      e[0]._4_2_ = (ushort)(sStack_18c < sStack_19c) * sStack_19c |
                   (ushort)(sStack_18c >= sStack_19c) * sStack_18c;
      e[0]._6_2_ = (ushort)(sStack_18a < sStack_19a) * sStack_19a |
                   (ushort)(sStack_18a >= sStack_19a) * sStack_18a;
      plVar26 = (longlong *)((long)__ptr_01 + (long)local_450 * 0x10);
      *plVar26 = vF[1];
      plVar26[1] = e[0];
      auVar31._8_7_ = uVar16;
      auVar31._0_8_ = uVar14;
      auVar31[0xf] = 0;
      auVar31 = psubusw(stack0xfffffffffffffae8,auVar31);
      local_1b8 = auVar31._0_2_;
      sStack_1b6 = auVar31._2_2_;
      sStack_1b4 = auVar31._4_2_;
      sStack_1b2 = auVar31._6_2_;
      sStack_1b0 = auVar31._8_2_;
      sStack_1ae = auVar31._10_2_;
      sStack_1ac = auVar31._12_2_;
      sStack_1aa = auVar31._14_2_;
      vH[1] = CONCAT26((ushort)(sStack_1b2 < sStack_1a2) * sStack_1a2 |
                       (ushort)(sStack_1b2 >= sStack_1a2) * sStack_1b2,
                       CONCAT24((ushort)(sStack_1b4 < sStack_1a4) * sStack_1a4 |
                                (ushort)(sStack_1b4 >= sStack_1a4) * sStack_1b4,
                                CONCAT22((ushort)(sStack_1b6 < sStack_1a6) * sStack_1a6 |
                                         (ushort)(sStack_1b6 >= sStack_1a6) * sStack_1b6,
                                         (ushort)(local_1b8 < local_1a8) * local_1a8 |
                                         (ushort)(local_1b8 >= local_1a8) * local_1b8)));
      vF[0]._0_2_ = (ushort)(sStack_1b0 < sStack_1a0) * sStack_1a0 |
                    (ushort)(sStack_1b0 >= sStack_1a0) * sStack_1b0;
      vF[0]._2_2_ = (ushort)(sStack_1ae < sStack_19e) * sStack_19e |
                    (ushort)(sStack_1ae >= sStack_19e) * sStack_1ae;
      vF[0]._4_2_ = (ushort)(sStack_1ac < sStack_19c) * sStack_19c |
                    (ushort)(sStack_1ac >= sStack_19c) * sStack_1ac;
      vF[0]._6_2_ = (ushort)(sStack_1aa < sStack_19a) * sStack_19a |
                    (ushort)(sStack_1aa >= sStack_19a) * sStack_1aa;
      _temp_1 = palVar22[local_450];
    }
    for (vGapO[1]._4_4_ = 0; vGapO[1]._4_4_ < 8; vGapO[1]._4_4_ = vGapO[1]._4_4_ + 1) {
      vF[0] = vF[0] << 0x10 | (ulong)vH[1] >> 0x30;
      vH[1] = vH[1] << 0x10;
      for (local_450 = 0; local_450 < iVar23; local_450 = local_450 + 1) {
        lVar5 = palVar21[local_450][0];
        lVar6 = palVar21[local_450][1];
        local_1d8 = (short)lVar5;
        sStack_1d6 = (short)((ulong)lVar5 >> 0x10);
        sStack_1d4 = (short)((ulong)lVar5 >> 0x20);
        sStack_1d2 = (short)((ulong)lVar5 >> 0x30);
        sStack_1d0 = (short)lVar6;
        sStack_1ce = (short)((ulong)lVar6 >> 0x10);
        sStack_1cc = (short)((ulong)lVar6 >> 0x20);
        sStack_1ca = (short)((ulong)lVar6 >> 0x30);
        local_1e8 = (short)vH[1];
        sStack_1e6 = vH[1]._2_2_;
        sStack_1e4 = vH[1]._4_2_;
        sStack_1e2 = vH[1]._6_2_;
        sStack_1e0 = (short)vH[2];
        sStack_1de = vH[2]._2_2_;
        sStack_1dc = vH[2]._4_2_;
        sStack_1da = vH[2]._6_2_;
        uVar28 = (ushort)(local_1d8 < local_1e8) * local_1e8 |
                 (ushort)(local_1d8 >= local_1e8) * local_1d8;
        uVar32 = (ushort)(sStack_1d6 < sStack_1e6) * sStack_1e6 |
                 (ushort)(sStack_1d6 >= sStack_1e6) * sStack_1d6;
        uVar33 = (ushort)(sStack_1d4 < sStack_1e4) * sStack_1e4 |
                 (ushort)(sStack_1d4 >= sStack_1e4) * sStack_1d4;
        uVar34 = (ushort)(sStack_1d2 < sStack_1e2) * sStack_1e2 |
                 (ushort)(sStack_1d2 >= sStack_1e2) * sStack_1d2;
        uVar35 = (ushort)(sStack_1d0 < sStack_1e0) * sStack_1e0 |
                 (ushort)(sStack_1d0 >= sStack_1e0) * sStack_1d0;
        uVar36 = (ushort)(sStack_1ce < sStack_1de) * sStack_1de |
                 (ushort)(sStack_1ce >= sStack_1de) * sStack_1ce;
        uVar37 = (ushort)(sStack_1cc < sStack_1dc) * sStack_1dc |
                 (ushort)(sStack_1cc >= sStack_1dc) * sStack_1cc;
        uVar38 = (ushort)(sStack_1ca < sStack_1da) * sStack_1da |
                 (ushort)(sStack_1ca >= sStack_1da) * sStack_1ca;
        temp_1 = CONCAT22(uVar32,uVar28);
        _temp_1 = CONCAT24(uVar33,temp_1);
        _temp_1 = CONCAT26(uVar34,_temp_1);
        vH[0]._0_2_ = uVar35;
        vH[0]._2_2_ = uVar36;
        vH[0]._4_2_ = uVar37;
        vH[0]._6_2_ = uVar38;
        vP._0_2_ = ((short)(ushort)vP < (short)uVar28) * uVar28 |
                   ((short)(ushort)vP >= (short)uVar28) * (ushort)vP;
        vP._2_2_ = ((short)vP._2_2_ < (short)uVar32) * uVar32 |
                   ((short)vP._2_2_ >= (short)uVar32) * vP._2_2_;
        vP._4_2_ = ((short)vP._4_2_ < (short)uVar33) * uVar33 |
                   ((short)vP._4_2_ >= (short)uVar33) * vP._4_2_;
        vP._6_2_ = ((short)vP._6_2_ < (short)uVar34) * uVar34 |
                   ((short)vP._6_2_ >= (short)uVar34) * vP._6_2_;
        vMaxColumn[0]._0_2_ =
             ((short)(ushort)vMaxColumn[0] < (short)uVar35) * uVar35 |
             ((short)(ushort)vMaxColumn[0] >= (short)uVar35) * (ushort)vMaxColumn[0];
        vMaxColumn[0]._2_2_ =
             ((short)vMaxColumn[0]._2_2_ < (short)uVar36) * uVar36 |
             ((short)vMaxColumn[0]._2_2_ >= (short)uVar36) * vMaxColumn[0]._2_2_;
        vMaxColumn[0]._4_2_ =
             ((short)vMaxColumn[0]._4_2_ < (short)uVar37) * uVar37 |
             ((short)vMaxColumn[0]._4_2_ >= (short)uVar37) * vMaxColumn[0]._4_2_;
        vMaxColumn[0]._6_2_ =
             ((short)vMaxColumn[0]._6_2_ < (short)uVar38) * uVar38 |
             ((short)vMaxColumn[0]._6_2_ >= (short)uVar38) * vMaxColumn[0]._6_2_;
        palVar21[local_450][0] = _temp_1;
        palVar21[local_450][1] = vH[0];
        auVar11._8_8_ = vH[0];
        auVar11._0_8_ = _temp_1;
        auVar10._8_7_ = uVar15;
        auVar10._0_8_ = uVar13;
        auVar10[0xf] = 0;
        auVar31 = psubusw(auVar11,auVar10);
        auVar9._8_7_ = uVar16;
        auVar9._0_8_ = uVar14;
        auVar9[0xf] = 0;
        register0x00001200 = psubusw(stack0xfffffffffffffae8,auVar9);
        local_78 = (short)vH[1];
        sStack_76 = vH[1]._2_2_;
        sStack_74 = vH[1]._4_2_;
        sStack_72 = vH[1]._6_2_;
        sStack_70 = (short)vH[2];
        sStack_6e = vH[2]._2_2_;
        sStack_6c = vH[2]._4_2_;
        sStack_6a = vH[2]._6_2_;
        local_88 = auVar31._0_2_;
        sStack_86 = auVar31._2_2_;
        sStack_84 = auVar31._4_2_;
        sStack_82 = auVar31._6_2_;
        sStack_80 = auVar31._8_2_;
        sStack_7e = auVar31._10_2_;
        sStack_7c = auVar31._12_2_;
        sStack_7a = auVar31._14_2_;
        uVar28 = -(ushort)(sStack_7a < sStack_6a);
        auVar8._2_2_ = -(ushort)(sStack_86 < sStack_76);
        auVar8._0_2_ = -(ushort)(local_88 < local_78);
        auVar8._4_2_ = -(ushort)(sStack_84 < sStack_74);
        auVar8._6_2_ = -(ushort)(sStack_82 < sStack_72);
        auVar8._8_2_ = -(ushort)(sStack_80 < sStack_70);
        auVar8._10_2_ = -(ushort)(sStack_7e < sStack_6e);
        auVar8._12_2_ = -(ushort)(sStack_7c < sStack_6c);
        auVar8._14_2_ = uVar28;
        if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar8 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar8 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar8 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar8 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar8 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar8 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar8 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar8 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar8 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar8 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (uVar28 >> 7 & 1) == 0) && sStack_7a >= sStack_6a) goto LAB_00105f24;
      }
    }
LAB_00105f24:
    vMaxMark[1]._0_2_ =
         ((short)(ushort)vMaxMark[1] < (short)(ushort)vP) * (ushort)vP |
         ((short)(ushort)vMaxMark[1] >= (short)(ushort)vP) * (ushort)vMaxMark[1];
    vMaxMark[1]._2_2_ =
         ((short)vMaxMark[1]._2_2_ < (short)vP._2_2_) * vP._2_2_ |
         ((short)vMaxMark[1]._2_2_ >= (short)vP._2_2_) * vMaxMark[1]._2_2_;
    vMaxMark[1]._4_2_ =
         ((short)vMaxMark[1]._4_2_ < (short)vP._4_2_) * vP._4_2_ |
         ((short)vMaxMark[1]._4_2_ >= (short)vP._4_2_) * vMaxMark[1]._4_2_;
    vMaxMark[1]._6_2_ =
         ((short)vMaxMark[1]._6_2_ < (short)vP._6_2_) * vP._6_2_ |
         ((short)vMaxMark[1]._6_2_ >= (short)vP._6_2_) * vMaxMark[1]._6_2_;
    vMaxScore[0]._0_2_ =
         ((short)(ushort)vMaxScore[0] < (short)(ushort)vMaxColumn[0]) * (ushort)vMaxColumn[0] |
         ((short)(ushort)vMaxScore[0] >= (short)(ushort)vMaxColumn[0]) * (ushort)vMaxScore[0];
    vMaxScore[0]._2_2_ =
         ((short)vMaxScore[0]._2_2_ < (short)vMaxColumn[0]._2_2_) * vMaxColumn[0]._2_2_ |
         ((short)vMaxScore[0]._2_2_ >= (short)vMaxColumn[0]._2_2_) * vMaxScore[0]._2_2_;
    vMaxScore[0]._4_2_ =
         ((short)vMaxScore[0]._4_2_ < (short)vMaxColumn[0]._4_2_) * vMaxColumn[0]._4_2_ |
         ((short)vMaxScore[0]._4_2_ >= (short)vMaxColumn[0]._4_2_) * vMaxScore[0]._4_2_;
    vMaxScore[0]._6_2_ =
         ((short)vMaxScore[0]._6_2_ < (short)vMaxColumn[0]._6_2_) * vMaxColumn[0]._6_2_ |
         ((short)vMaxScore[0]._6_2_ >= (short)vMaxColumn[0]._6_2_) * vMaxScore[0]._6_2_;
    local_58 = (ushort)vTemp[1];
    uStack_56 = (ushort)((ulong)vTemp[1] >> 0x10);
    uStack_54 = (ushort)((ulong)vTemp[1] >> 0x20);
    uStack_52 = (ushort)((ulong)vTemp[1] >> 0x30);
    uStack_50 = (ushort)vMaxMark[0];
    uStack_4e = (ushort)((ulong)vMaxMark[0] >> 0x10);
    uStack_4c = (ushort)((ulong)vMaxMark[0] >> 0x20);
    uStack_4a = (ushort)((ulong)vMaxMark[0] >> 0x30);
    uVar28 = -(ushort)(uStack_4a == vMaxScore[0]._6_2_);
    auVar7._2_2_ = -(ushort)(uStack_56 == vMaxMark[1]._2_2_);
    auVar7._0_2_ = -(ushort)(local_58 == (ushort)vMaxMark[1]);
    auVar7._4_2_ = -(ushort)(uStack_54 == vMaxMark[1]._4_2_);
    auVar7._6_2_ = -(ushort)(uStack_52 == vMaxMark[1]._6_2_);
    uVar2 = CONCAT26(uVar28,CONCAT24(-(ushort)(uStack_4c == vMaxScore[0]._4_2_),
                                     CONCAT22(-(ushort)(uStack_4e == vMaxScore[0]._2_2_),
                                              -(ushort)(uStack_50 == (ushort)vMaxScore[0]))));
    auVar7._8_8_ = uVar2;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 | (ushort)((byte)(uVar2 >> 7) & 1) << 8
                 | (ushort)((byte)(uVar2 >> 0xf) & 1) << 9 |
                 (ushort)((byte)(uVar2 >> 0x17) & 1) << 10 |
                 (ushort)((byte)(uVar2 >> 0x1f) & 1) << 0xb |
                 (ushort)((byte)(uVar2 >> 0x27) & 1) << 0xc |
                 (ushort)((byte)(uVar2 >> 0x2f) & 1) << 0xd |
                 (ushort)((byte)(uVar28 >> 7) & 1) << 0xe | uVar28 & 0x8000) != 0xffff) {
      vTemp[1] = CONCAT26(vMaxMark[1]._6_2_,
                          CONCAT24(vMaxMark[1]._4_2_,CONCAT22(vMaxMark[1]._2_2_,(ushort)vMaxMark[1])
                                  ));
      vMaxMark[0] = CONCAT26(vMaxScore[0]._6_2_,
                             CONCAT24(vMaxScore[0]._4_2_,
                                      CONCAT22(vMaxScore[0]._2_2_,(ushort)vMaxScore[0])));
      uVar28 = ((short)(ushort)vMaxMark[1] < (short)(ushort)vMaxScore[0]) * (ushort)vMaxScore[0] |
               ((short)(ushort)vMaxMark[1] >= (short)(ushort)vMaxScore[0]) * (ushort)vMaxMark[1];
      uVar32 = ((short)vMaxMark[1]._2_2_ < (short)vMaxScore[0]._2_2_) * vMaxScore[0]._2_2_ |
               ((short)vMaxMark[1]._2_2_ >= (short)vMaxScore[0]._2_2_) * vMaxMark[1]._2_2_;
      uVar33 = ((short)vMaxMark[1]._4_2_ < (short)vMaxScore[0]._4_2_) * vMaxScore[0]._4_2_ |
               ((short)vMaxMark[1]._4_2_ >= (short)vMaxScore[0]._4_2_) * vMaxMark[1]._4_2_;
      uVar34 = ((short)vMaxMark[1]._6_2_ < (short)vMaxScore[0]._6_2_) * vMaxScore[0]._6_2_ |
               ((short)vMaxMark[1]._6_2_ >= (short)vMaxScore[0]._6_2_) * vMaxMark[1]._6_2_;
      uVar28 = ((short)uVar28 < (short)uVar33) * uVar33 | ((short)uVar28 >= (short)uVar33) * uVar28;
      uVar32 = ((short)uVar32 < (short)uVar34) * uVar34 | ((short)uVar32 >= (short)uVar34) * uVar32;
      uVar28 = ((short)uVar28 < (short)uVar32) * uVar32 | ((short)uVar28 >= (short)uVar32) * uVar28;
      if ((ushort)end_ref < uVar28) {
        local_400 = k;
        for (local_450 = 0; end_ref._0_2_ = uVar28, local_450 < iVar23; local_450 = local_450 + 1) {
          lVar5 = palVar21[local_450][1];
          *(longlong *)(__ptr_02 + (long)local_450 * 8) = palVar21[local_450][0];
          *(longlong *)(__ptr_02 + (long)local_450 * 8 + 4) = lVar5;
        }
      }
    }
    uVar28 = ((short)(ushort)vP < (short)(ushort)vMaxColumn[0]) * (ushort)vMaxColumn[0] |
             ((short)(ushort)vP >= (short)(ushort)vMaxColumn[0]) * (ushort)vP;
    uVar32 = ((short)vP._2_2_ < (short)vMaxColumn[0]._2_2_) * vMaxColumn[0]._2_2_ |
             ((short)vP._2_2_ >= (short)vMaxColumn[0]._2_2_) * vP._2_2_;
    uVar33 = ((short)vP._4_2_ < (short)vMaxColumn[0]._4_2_) * vMaxColumn[0]._4_2_ |
             ((short)vP._4_2_ >= (short)vMaxColumn[0]._4_2_) * vP._4_2_;
    uVar34 = ((short)vP._6_2_ < (short)vMaxColumn[0]._6_2_) * vMaxColumn[0]._6_2_ |
             ((short)vP._6_2_ >= (short)vMaxColumn[0]._6_2_) * vP._6_2_;
    uVar28 = ((short)uVar28 < (short)uVar33) * uVar33 | ((short)uVar28 >= (short)uVar33) * uVar28;
    uVar32 = ((short)uVar32 < (short)uVar34) * uVar34 | ((short)uVar32 >= (short)uVar34) * uVar32;
    *(ushort *)((long)__ptr + (long)k * 2) =
         ((short)uVar28 < (short)uVar32) * uVar32 | ((short)uVar28 >= (short)uVar32) * uVar28;
    if (*(uint16_t *)((long)__ptr + (long)k * 2) == terminate) break;
  }
  puStack_4c0 = __ptr_02;
  for (k = 0; k < iVar23 << 3; k = k + 1) {
    if ((*puStack_4c0 == (ushort)end_ref) && (iVar24 = k / 8 + (k % 8) * iVar23, iVar24 < segLen)) {
      segLen = iVar24;
    }
    puStack_4c0 = puStack_4c0 + 1;
  }
  free(__ptr_02);
  free(__ptr_01);
  free(pvE);
  free(pvHLoad);
  paVar27 = (alignment_end *)calloc(2,0xc);
  paVar27->score = (ushort)end_ref;
  paVar27->ref = local_400;
  paVar27->read = segLen;
  paVar27[1].score = 0;
  paVar27[1].ref = 0;
  paVar27[1].read = 0;
  if (local_400 - maskLen < 1) {
    local_558 = 0;
  }
  else {
    local_558 = local_400 - maskLen;
  }
  for (k = 0; k < local_558; k = k + 1) {
    if (paVar27[1].score < *(ushort *)((long)__ptr + (long)k * 2)) {
      paVar27[1].score = *(uint16_t *)((long)__ptr + (long)k * 2);
      paVar27[1].ref = k;
    }
  }
  local_55c = refLen;
  if (local_400 + maskLen <= refLen) {
    local_55c = local_400 + maskLen;
  }
  for (k = local_55c; k < refLen; k = k + 1) {
    if (paVar27[1].score < *(ushort *)((long)__ptr + (long)k * 2)) {
      paVar27[1].score = *(uint16_t *)((long)__ptr + (long)k * 2);
      paVar27[1].ref = k;
    }
  }
  free(__ptr);
  free(__ptr_00);
  return paVar27;
}

Assistant:

static alignment_end* sw_sse2_word (const int8_t* ref,
							 int8_t ref_dir,	/* 0: forward ref; 1: reverse ref*/
							 int32_t refLen,
							 int32_t readLen,
							 const uint8_t weight_gapO, /* will be used as - */
							 const uint8_t weight_gapE, /* will be used as - */
							 const __m128i* vProfile,
							 uint16_t terminate,
							 int32_t maskLen) {

#define max8(m, vm) (vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 8)); \
					(vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 4)); \
					(vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 2)); \
					(m) = _mm_extract_epi16((vm), 0)

	uint16_t max = 0;		                     /* the max alignment score */
	int32_t end_read = readLen - 1;
	int32_t end_ref = 0; /* 1_based best alignment ending point; Initialized as isn't aligned - 0. */
	int32_t segLen = (readLen + 7) / 8; /* number of segment */

	/* array to record the largest score of each reference position */
	uint16_t* maxColumn = (uint16_t*) calloc(refLen, 2);

	/* array to record the alignment read ending position of the largest score of each reference position */
	int32_t* end_read_column = (int32_t*) calloc(refLen, sizeof(int32_t));

	/* Define 16 byte 0 vector. */
	__m128i vZero = _mm_set1_epi32(0);

	__m128i* pvHStore = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvHLoad = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvE = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvHmax = (__m128i*) calloc(segLen, sizeof(__m128i));

	int32_t i, j, k;
	/* 16 byte insertion begin vector */
	__m128i vGapO = _mm_set1_epi16(weight_gapO);

	/* 16 byte insertion extension vector */
	__m128i vGapE = _mm_set1_epi16(weight_gapE);

	__m128i vMaxScore = vZero; /* Trace the highest score of the whole SW matrix. */
	__m128i vMaxMark = vZero; /* Trace the highest score till the previous column. */
	__m128i vTemp;
	int32_t edge, begin = 0, end = refLen, step = 1;
	uint16_t *t;
	int32_t column_len;
	alignment_end* bests;

	/* outer loop to process the reference sequence */
	if (ref_dir == 1) {
		begin = refLen - 1;
		end = -1;
		step = -1;
	}
	for (i = begin; LIKELY(i != end); i += step) {
		__m128i* pv;
		__m128i vMaxColumn;
		const __m128i* vP;
		int32_t cmp;
		__m128i e, vF = vZero; /* Initialize F value to 0.
							   Any errors to vH values will be corrected in the Lazy_F loop.
							 */
		__m128i vH = pvHStore[segLen - 1];
		vH = _mm_slli_si128 (vH, 2); /* Shift the 128-bit value in vH left by 2 byte. */

		/* Swap the 2 H buffers. */
		pv = pvHLoad;

		vMaxColumn = vZero; /* vMaxColumn is used to record the max values of column i. */

		vP = vProfile + ref[i] * segLen; /* Right part of the vProfile */
		pvHLoad = pvHStore;
		pvHStore = pv;

		/* inner loop to process the query sequence */
		for (j = 0; LIKELY(j < segLen); j ++) {
			vH = _mm_adds_epi16(vH, _mm_load_si128(vP + j));

			/* Get max from vH, vE and vF. */
			e = _mm_load_si128(pvE + j);
			vH = _mm_max_epi16(vH, e);
			vH = _mm_max_epi16(vH, vF);
			vMaxColumn = _mm_max_epi16(vMaxColumn, vH);

			/* Save vH values. */
			_mm_store_si128(pvHStore + j, vH);

			/* Update vE value. */
			vH = _mm_subs_epu16(vH, vGapO); /* saturation arithmetic, result >= 0 */
			e = _mm_subs_epu16(e, vGapE);
			e = _mm_max_epi16(e, vH);
			_mm_store_si128(pvE + j, e);

			/* Update vF value. */
			vF = _mm_subs_epu16(vF, vGapE);
			vF = _mm_max_epi16(vF, vH);

			/* Load the next vH. */
			vH = _mm_load_si128(pvHLoad + j);
		}

		/* Lazy_F loop: has been revised to disallow adjecent insertion and then deletion, so don't update E(i, j), learn from SWPS3 */
		for (k = 0; LIKELY(k < 8); ++k) {
			vF = _mm_slli_si128 (vF, 2);
			for (j = 0; LIKELY(j < segLen); ++j) {
				vH = _mm_load_si128(pvHStore + j);
				vH = _mm_max_epi16(vH, vF);
				vMaxColumn = _mm_max_epi16(vMaxColumn, vH); /*newly added line*/
				_mm_store_si128(pvHStore + j, vH);
				vH = _mm_subs_epu16(vH, vGapO);
				vF = _mm_subs_epu16(vF, vGapE);
				if (UNLIKELY(! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH)))) goto end;
			}
		}

end:
		vMaxScore = _mm_max_epi16(vMaxScore, vMaxColumn);
		vTemp = _mm_cmpeq_epi16(vMaxMark, vMaxScore);
		cmp = _mm_movemask_epi8(vTemp);
		if (cmp != 0xffff) {
			uint16_t temp;
			vMaxMark = vMaxScore;
			max8(temp, vMaxScore);
			vMaxScore = vMaxMark;

			if (LIKELY(temp > max)) {
				max = temp;
				end_ref = i;
				for (j = 0; LIKELY(j < segLen); ++j) pvHmax[j] = pvHStore[j];
			}
		}

		/* Record the max score of current column. */
		max8(maxColumn[i], vMaxColumn);
		if (maxColumn[i] == terminate) break;
	}

	/* Trace the alignment ending position on read. */
	t = (uint16_t*)pvHmax;
	column_len = segLen * 8;
	for (i = 0; LIKELY(i < column_len); ++i, ++t) {
		int32_t temp;
		if (*t == max) {
			temp = i / 8 + i % 8 * segLen;
			if (temp < end_read) end_read = temp;
		}
	}

	free(pvHmax);
	free(pvE);
	free(pvHLoad);
	free(pvHStore);

	/* Find the most possible 2nd best alignment. */
	bests = (alignment_end*) calloc(2, sizeof(alignment_end));
	bests[0].score = max;
	bests[0].ref = end_ref;
	bests[0].read = end_read;

	bests[1].score = 0;
	bests[1].ref = 0;
	bests[1].read = 0;

	edge = (end_ref - maskLen) > 0 ? (end_ref - maskLen) : 0;
	for (i = 0; i < edge; i ++) {
		if (maxColumn[i] > bests[1].score) {
			bests[1].score = maxColumn[i];
			bests[1].ref = i;
		}
	}
	edge = (end_ref + maskLen) > refLen ? refLen : (end_ref + maskLen);
	for (i = edge; i < refLen; i ++) {
		if (maxColumn[i] > bests[1].score) {
			bests[1].score = maxColumn[i];
			bests[1].ref = i;
		}
	}

	free(maxColumn);
	free(end_read_column);
	return bests;
}